

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void blkmar_guards(monst *shkp)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  boolean mesg_given;
  eshk *eshkp;
  monst *mt;
  monst *shkp_local;
  
  bVar1 = false;
  if (blkmar_guards::rlock == '\0') {
    blkmar_guards::rlock = '\x01';
    hot_pursuit(shkp);
    for (eshkp = (eshk *)level->monlist; eshkp != (eshk *)0x0; eshkp = *(eshk **)eshkp->bill) {
      if ((((0 < eshkp->bill[2].bquan) && ((char)eshkp->bill[5].price == '\0')) &&
          (&eshkp->bill[7].useup + (int)*(short *)((long)&eshkp->bill[6].bquan + 2) !=
           (boolean *)0x0)) &&
         ((((&eshkp->bill[7].useup)[(int)*(short *)((long)&eshkp->bill[6].bquan + 2)] != '\0' &&
           ((eshkp->bill[6].bo_id >> 0x16 & 1) != 0)) &&
          ((eshkp != (eshk *)shkp &&
           (cVar2 = inside_shop(level,*(xchar *)((long)&eshkp->bill[4].bquan + 3),
                                (xchar)eshkp->bill[5].bo_id), cVar2 == (char)shkp[0x1b].meating)))))
         ) {
        if (!bVar1) {
          pcVar4 = noit_Monnam(shkp);
          iVar3 = pronoun_gender(level,shkp);
          pline("%s calls for %s assistants!",pcVar4,genders[iVar3].his);
          bVar1 = true;
        }
        wakeup((monst *)eshkp);
      }
    }
    blkmar_guards::rlock = '\0';
  }
  return;
}

Assistant:

void blkmar_guards(struct monst *shkp)
{
	struct monst *mt;
	struct eshk *eshkp = ESHK(shkp);
	boolean mesg_given = FALSE; /* Only give message if assistants peaceful */
	static boolean rlock = FALSE; /* Prevent recursive calls (via wakeup) */

	if (rlock) return;
	rlock = TRUE;

	/* allow black marketeer to leave his shop */
	hot_pursuit(shkp);

	/* wake up assistants */
	for (mt = level->monlist; mt; mt = mt->nmon) {
	    if (DEADMONSTER(mt)) continue;
	    /* non-tame named monsters are presumably
	     * black marketeer's assistants */
	    if (!mt->mtame && NAME(mt) && *NAME(mt) && mt->mpeaceful &&
		mt != shkp && inside_shop(level, mt->mx, mt->my) == eshkp->shoproom) {
		if (!mesg_given) {
		    pline("%s calls for %s assistants!",
			    noit_Monnam(shkp), mhis(level, shkp));
		    mesg_given = TRUE;
		}
		wakeup(mt);
	    }
	}
	rlock = FALSE;
}